

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O2

CharInfo __thiscall
MeCab::CharProperty::getCharInfo(CharProperty *this,char *begin,char *end,size_t *mblen)

{
  byte bVar1;
  char cVar2;
  unsigned_short uVar3;
  uint uVar4;
  
  switch(this->charset_) {
  default:
    uVar3 = utf8_to_ucs2(begin,end,mblen);
    uVar4 = (uint)uVar3;
    goto LAB_0011828c;
  case 3:
  case 4:
    if ((ulong)((long)end - (long)begin) < 2) {
LAB_0011826e:
      *mblen = 1;
      uVar4 = 0;
      goto LAB_0011828c;
    }
    *mblen = 2;
    bVar1 = *begin;
    cVar2 = begin[1];
    break;
  case 5:
    if ((ulong)((long)end - (long)begin) < 2) goto LAB_0011826e;
    *mblen = 2;
    bVar1 = begin[1];
    cVar2 = *begin;
  }
  uVar4 = (int)cVar2 | (uint)bVar1 << 8;
LAB_0011828c:
  return this->map_[uVar4 & 0xffff];
}

Assistant:

inline CharInfo getCharInfo(const char *begin,
                              const char *end,
                              size_t *mblen) const {
    unsigned short int t = 0;
#ifndef MECAB_USE_UTF8_ONLY
    switch (charset_) {
      case EUC_JP:  t = euc_to_ucs2(begin, end, mblen); break;
      case CP932:   t = cp932_to_ucs2(begin, end, mblen); break;
      case UTF8:    t = utf8_to_ucs2(begin, end, mblen); break;
      case UTF16:   t = utf16_to_ucs2(begin, end, mblen); break;
      case UTF16LE: t = utf16le_to_ucs2(begin, end, mblen); break;
      case UTF16BE: t = utf16be_to_ucs2(begin, end, mblen); break;
      case ASCII:   t = ascii_to_ucs2(begin, end, mblen); break;
      default:      t = utf8_to_ucs2(begin, end, mblen); break;
    }
#else
    switch (charset_) {
      case UTF8:    t = utf8_to_ucs2(begin, end, mblen); break;
      case UTF16:   t = utf16_to_ucs2(begin, end, mblen); break;
      case UTF16LE: t = utf16le_to_ucs2(begin, end, mblen); break;
      case UTF16BE: t = utf16be_to_ucs2(begin, end, mblen); break;
      default:      t = utf8_to_ucs2(begin, end, mblen); break;
    }
#endif
    return map_[t];
  }